

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  long lVar1;
  uint *puVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  fpclass_type fVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  int *piVar16;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_1bc;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> local_f8;
  int *local_b8;
  pointer local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  long local_90;
  long local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  long local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.exp = 0;
  local_178.neg = false;
  iVar6 = (this->l).firstUpdate;
  local_90 = (long)iVar6;
  iVar8 = (this->l).firstUnused;
  local_1bc = n;
  if (iVar6 < iVar8) {
    local_b0 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_b8 = (this->l).idx;
    local_98 = (this->l).row;
    local_a0 = (this->l).start;
    lVar10 = (long)iVar8;
    local_a8 = nonz;
    local_80 = eps;
    do {
      lVar1 = lVar10 + -1;
      iVar6 = local_98[lVar10 + -1];
      local_f8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
      local_f8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar6].m_backend.data._M_elems;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 2);
      puVar2 = vec[iVar6].m_backend.data._M_elems + 4;
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_f8.exp = vec[iVar6].m_backend.exp;
      local_f8.neg = vec[iVar6].m_backend.neg;
      local_f8.fpclass = vec[iVar6].m_backend.fpclass;
      local_f8.prec_elem = vec[iVar6].m_backend.prec_elem;
      local_88 = lVar1;
      if (local_f8.fpclass == cpp_dec_float_NaN) {
LAB_00290270:
        lVar11 = (long)local_a0[lVar1];
        iVar6 = local_a0[lVar10];
        if (local_a0[lVar1] < iVar6) {
          piVar16 = local_b8 + lVar11;
          pcVar14 = &local_b0[lVar11].m_backend;
          local_70 = lVar11;
          do {
            iVar8 = *piVar16;
            pnVar15 = vec + iVar8;
            local_178.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 8)
            ;
            local_178.data._M_elems._0_8_ = *(undefined8 *)vec[iVar8].m_backend.data._M_elems;
            local_178.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 2);
            puVar2 = vec[iVar8].m_backend.data._M_elems + 4;
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_178.exp = vec[iVar8].m_backend.exp;
            local_178.neg = vec[iVar8].m_backend.neg;
            local_178.fpclass = vec[iVar8].m_backend.fpclass;
            local_178.prec_elem = vec[iVar8].m_backend.prec_elem;
            if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_00290349:
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems._0_16_ = ZEXT816(0);
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              pcVar13 = &local_f8;
              if (pcVar14 != &local_1b8) {
                local_1b8.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
                local_1b8.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
                local_1b8.data._M_elems[4] = local_f8.data._M_elems[4];
                local_1b8.data._M_elems[5] = local_f8.data._M_elems[5];
                local_1b8.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
                local_1b8.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
                local_1b8.data._M_elems[2] = local_f8.data._M_elems[2];
                local_1b8.data._M_elems[3] = local_f8.data._M_elems[3];
                local_1b8.data._M_elems[0] = local_f8.data._M_elems[0];
                local_1b8.data._M_elems[1] = local_f8.data._M_elems[1];
                local_1b8.exp = local_f8.exp;
                local_1b8.neg = local_f8.neg;
                local_1b8.fpclass = local_f8.fpclass;
                local_1b8.prec_elem = local_f8.prec_elem;
                pcVar13 = pcVar14;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1b8,pcVar13);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_178,&local_1b8);
              fVar9 = cpp_dec_float_NaN;
              if (local_178.fpclass == cpp_dec_float_NaN) {
LAB_0029041f:
                local_138.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
                local_138.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
                local_138.data._M_elems[4] = local_178.data._M_elems[4];
                local_138.data._M_elems[5] = local_178.data._M_elems[5];
                local_138.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
                local_138.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
                local_138.data._M_elems[0] = local_178.data._M_elems[0];
                local_138.data._M_elems[1] = local_178.data._M_elems[1];
                local_138.data._M_elems[2] = local_178.data._M_elems[2];
                local_138.data._M_elems[3] = local_178.data._M_elems[3];
                pcVar13 = &local_178;
                iVar8 = local_178.exp;
                bVar12 = local_178.neg;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,&local_1b8);
                if (iVar8 != 0) {
                  fVar9 = local_178.fpclass;
                  goto LAB_0029041f;
                }
                local_138.fpclass = cpp_dec_float_finite;
                local_138.prec_elem = 10;
                local_138.data._M_elems[0] = 0;
                local_138.data._M_elems[1] = 0;
                local_138.data._M_elems[2] = 0;
                local_138.data._M_elems[3] = 0;
                local_138.data._M_elems[4] = 0;
                local_138.data._M_elems[5] = 0;
                local_138.data._M_elems._24_5_ = 0;
                local_138.data._M_elems[7]._1_3_ = 0;
                local_138.data._M_elems._32_5_ = 0;
                local_138.data._M_elems[9]._1_3_ = 0;
                local_138.exp = 0;
                local_138.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_138,1e-100);
                pcVar13 = &local_138;
                fVar9 = local_138.fpclass;
                iVar8 = local_138.exp;
                bVar12 = local_138.neg;
              }
              iVar3 = pcVar13->prec_elem;
              *(ulong *)((pnVar15->m_backend).data._M_elems + 8) =
                   CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
              *(undefined8 *)((pnVar15->m_backend).data._M_elems + 4) =
                   local_138.data._M_elems._16_8_;
              *(ulong *)((pnVar15->m_backend).data._M_elems + 6) =
                   CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
              *(undefined8 *)(pnVar15->m_backend).data._M_elems = local_138.data._M_elems._0_8_;
              *(undefined8 *)((pnVar15->m_backend).data._M_elems + 2) =
                   local_138.data._M_elems._8_8_;
              (pnVar15->m_backend).exp = iVar8;
              (pnVar15->m_backend).neg = bVar12;
              (pnVar15->m_backend).fpclass = fVar9;
              (pnVar15->m_backend).prec_elem = iVar3;
              uVar4 = local_178.data._M_elems._16_8_;
            }
            else {
              local_78 = pnVar15;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              pnVar15 = local_78;
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1b8);
              if (iVar7 != 0) goto LAB_00290349;
              local_138.data._M_elems[0] = local_f8.data._M_elems[0];
              local_138.data._M_elems[1] = local_f8.data._M_elems[1];
              uVar4 = local_138.data._M_elems._0_8_;
              local_138.data._M_elems[2] = local_f8.data._M_elems[2];
              local_138.data._M_elems[3] = local_f8.data._M_elems[3];
              local_138.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
              local_138.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
              local_138.data._M_elems[4] = local_f8.data._M_elems[4];
              local_138.data._M_elems[5] = local_f8.data._M_elems[5];
              local_138.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
              local_138.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
              local_138.exp = local_f8.exp;
              fVar9 = local_f8.fpclass;
              iVar3 = local_f8.prec_elem;
              local_138.fpclass = local_f8.fpclass;
              local_138.prec_elem = local_f8.prec_elem;
              local_138.data._M_elems[0] = local_f8.data._M_elems[0];
              local_138.neg = local_f8.neg;
              if (local_138.data._M_elems[0] != 0 || fVar9 != cpp_dec_float_finite) {
                local_138.neg = (bool)(local_f8.neg ^ 1);
              }
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems[0] = 0;
              local_1b8.data._M_elems[1] = 0;
              local_1b8.data._M_elems[2] = 0;
              local_1b8.data._M_elems[3] = 0;
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              pcVar13 = &local_138;
              if (pcVar14 != &local_1b8) {
                local_1b8.data._M_elems[4] = local_f8.data._M_elems[4];
                local_1b8.data._M_elems[5] = local_f8.data._M_elems[5];
                local_1b8.data._M_elems[0] = local_f8.data._M_elems[0];
                local_1b8.data._M_elems[1] = local_f8.data._M_elems[1];
                local_1b8.data._M_elems[2] = local_f8.data._M_elems[2];
                local_1b8.data._M_elems[3] = local_f8.data._M_elems[3];
                local_1b8.exp = local_f8.exp;
                local_1b8.fpclass = fVar9;
                local_1b8.prec_elem = iVar3;
                pcVar13 = pcVar14;
                local_1b8.data._M_elems._24_5_ = local_138.data._M_elems._24_5_;
                local_1b8.data._M_elems[7]._1_3_ = local_138.data._M_elems[7]._1_3_;
                local_1b8.data._M_elems._32_5_ = local_138.data._M_elems._32_5_;
                local_1b8.data._M_elems[9]._1_3_ = local_138.data._M_elems[9]._1_3_;
                local_1b8.neg = local_138.neg;
              }
              local_138.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1b8,pcVar13);
              local_178.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
              local_178.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
              uVar4._0_4_ = local_1b8.data._M_elems[4];
              uVar4._4_4_ = local_1b8.data._M_elems[5];
              local_178.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_178.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_178.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
              local_178.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
              local_178.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_178.data._M_elems[1] = local_1b8.data._M_elems[1];
              local_178.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_178.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_178.exp = local_1b8.exp;
              local_178.neg = local_1b8.neg;
              local_178.prec_elem = local_1b8.prec_elem;
              local_178.fpclass = local_1b8.fpclass;
              auVar5 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
              local_68.data._M_elems._32_8_ =
                   *(undefined8 *)((local_80->m_backend).data._M_elems + 8);
              local_68.data._M_elems._0_8_ = *(undefined8 *)(local_80->m_backend).data._M_elems;
              local_68.data._M_elems._8_8_ =
                   *(undefined8 *)((local_80->m_backend).data._M_elems + 2);
              local_68.data._M_elems._16_8_ =
                   *(undefined8 *)((local_80->m_backend).data._M_elems + 4);
              local_68.data._M_elems._24_8_ =
                   *(undefined8 *)((local_80->m_backend).data._M_elems + 6);
              local_68.exp = (local_80->m_backend).exp;
              local_68.neg = (local_80->m_backend).neg;
              local_68.fpclass = (local_80->m_backend).fpclass;
              local_68.prec_elem = (local_80->m_backend).prec_elem;
              if ((local_1b8.neg == true) &&
                 (local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite)) {
                local_1b8.neg = false;
              }
              local_1b8.data._M_elems._0_16_ = auVar5;
              if ((local_68.fpclass != cpp_dec_float_NaN && local_1b8.fpclass != cpp_dec_float_NaN)
                 && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_1b8,&local_68),
                    uVar4 = local_178.data._M_elems._16_8_, 0 < iVar7)) {
                *(undefined8 *)((pnVar15->m_backend).data._M_elems + 8) =
                     local_178.data._M_elems._32_8_;
                *(undefined8 *)((pnVar15->m_backend).data._M_elems + 4) =
                     local_178.data._M_elems._16_8_;
                *(ulong *)((pnVar15->m_backend).data._M_elems + 6) =
                     CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
                *(undefined8 *)(pnVar15->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
                *(undefined8 *)((pnVar15->m_backend).data._M_elems + 2) =
                     local_178.data._M_elems._8_8_;
                (pnVar15->m_backend).exp = local_178.exp;
                (pnVar15->m_backend).neg = local_178.neg;
                (pnVar15->m_backend).fpclass = local_178.fpclass;
                (pnVar15->m_backend).prec_elem = local_178.prec_elem;
                lVar10 = (long)local_1bc;
                local_1bc = local_1bc + 1;
                local_a8[lVar10] = iVar8;
              }
            }
            local_178.data._M_elems._16_8_ = uVar4;
            piVar16 = piVar16 + 1;
            pcVar14 = pcVar14 + 1;
            iVar6 = iVar6 + -1;
          } while ((int)local_70 < iVar6);
        }
      }
      else {
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 10;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems._24_5_ = 0;
        local_1b8.data._M_elems[7]._1_3_ = 0;
        local_1b8.data._M_elems._32_5_ = 0;
        local_1b8.data._M_elems[9]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1b8,0.0);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_f8,&local_1b8);
        if (iVar6 != 0) goto LAB_00290270;
      }
      lVar10 = local_88;
    } while (local_90 < local_88);
  }
  return local_1bc;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}